

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O2

void QGraphicsDropShadowEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPointF *pQVar1;
  bool bVar2;
  QColor *color;
  qreal qVar3;
  QColor QVar4;
  QPointF QVar5;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      offsetChanged((QGraphicsDropShadowEffect *)_o,(QPointF *)_a[1]);
      return;
    case 1:
      blurRadiusChanged((QGraphicsDropShadowEffect *)_o,*_a[1]);
      return;
    case 2:
      colorChanged((QGraphicsDropShadowEffect *)_o,(QColor *)_a[1]);
      return;
    case 3:
      color = (QColor *)_a[1];
switchD_00375a4e_caseD_0:
      setOffset((QGraphicsDropShadowEffect *)_o,(QPointF *)color);
      return;
    case 4:
      setOffset((QGraphicsDropShadowEffect *)_o,*_a[1],*_a[2]);
      return;
    case 5:
      setOffset((QGraphicsDropShadowEffect *)_o,*_a[1]);
      return;
    case 6:
      qVar3 = *_a[1];
LAB_00375b77:
      setXOffset((QGraphicsDropShadowEffect *)_o,qVar3);
      return;
    case 7:
      qVar3 = *_a[1];
LAB_00375b4d:
      setYOffset((QGraphicsDropShadowEffect *)_o,qVar3);
      return;
    case 8:
      qVar3 = *_a[1];
LAB_00375b85:
      setBlurRadius((QGraphicsDropShadowEffect *)_o,qVar3);
      return;
    case 9:
      color = (QColor *)_a[1];
switchD_00375a4e_caseD_4:
      setColor((QGraphicsDropShadowEffect *)_o,color);
      return;
    }
    break;
  case ReadProperty:
    if (4 < (uint)_id) {
      return;
    }
    pQVar1 = (QPointF *)*_a;
    switch(_id) {
    case 0:
      QVar5 = offset((QGraphicsDropShadowEffect *)_o);
      *pQVar1 = QVar5;
      break;
    case 1:
      QVar5 = offset((QGraphicsDropShadowEffect *)_o);
      qVar3 = QVar5.xp;
      goto LAB_00375b0b;
    case 2:
      QVar5 = offset((QGraphicsDropShadowEffect *)_o);
      pQVar1->xp = QVar5.yp;
      break;
    case 3:
      qVar3 = blurRadius((QGraphicsDropShadowEffect *)_o);
LAB_00375b0b:
      pQVar1->xp = qVar3;
      break;
    case 4:
      QVar4 = QGraphicsDropShadowEffect::color((QGraphicsDropShadowEffect *)_o);
      pQVar1->xp = QVar4._0_8_;
      *(int *)&pQVar1->yp = QVar4.ct._4_4_;
      *(short *)((long)&pQVar1->yp + 4) = QVar4.ct._8_2_;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      color = (QColor *)*_a;
      switch(_id) {
      case 1:
        qVar3 = *(qreal *)color;
        goto LAB_00375b77;
      case 2:
        qVar3 = *(qreal *)color;
        goto LAB_00375b4d;
      case 3:
        qVar3 = *(qreal *)color;
        goto LAB_00375b85;
      case 4:
        goto switchD_00375a4e_caseD_4;
      }
      goto switchD_00375a4e_caseD_0;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsDropShadowEffect::*)(QPointF_const&)>
                      ((QtMocHelpers *)_a,(void **)offsetChanged,0,0);
    if ((!bVar2) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsDropShadowEffect::*)(double)>
                          ((QtMocHelpers *)_a,(void **)blurRadiusChanged,0,1), !bVar2)) {
      QtMocHelpers::indexOfMethod<void(QGraphicsDropShadowEffect::*)(QColor_const&)>
                ((QtMocHelpers *)_a,(void **)colorChanged,0,2);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsDropShadowEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsDropShadowEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->offsetChanged((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 1: _t->blurRadiusChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 2: _t->colorChanged((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 3: _t->setOffset((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 4: _t->setOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qreal>>(_a[2]))); break;
        case 5: _t->setOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 6: _t->setXOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 7: _t->setYOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 8: _t->setBlurRadius((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 9: _t->setColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(const QPointF & )>(_a, &QGraphicsDropShadowEffect::offsetChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(qreal )>(_a, &QGraphicsDropShadowEffect::blurRadiusChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(const QColor & )>(_a, &QGraphicsDropShadowEffect::colorChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QPointF*>(_v) = _t->offset(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->xOffset(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->yOffset(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->blurRadius(); break;
        case 4: *reinterpret_cast<QColor*>(_v) = _t->color(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOffset(*reinterpret_cast<QPointF*>(_v)); break;
        case 1: _t->setXOffset(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setYOffset(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setBlurRadius(*reinterpret_cast<qreal*>(_v)); break;
        case 4: _t->setColor(*reinterpret_cast<QColor*>(_v)); break;
        default: break;
        }
    }
}